

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall QMultiHash<int,_int>::detach_helper(QMultiHash<int,_int> *this)

{
  bool bVar1;
  Data<QHashPrivate::MultiNode<int,_int>_> *pDVar2;
  long *in_RDI;
  Data *dd;
  Data<QHashPrivate::MultiNode<int,_int>_> *in_stack_ffffffffffffffd0;
  void *pvVar3;
  size_t in_stack_ffffffffffffffd8;
  
  if (*in_RDI == 0) {
    pDVar2 = (Data<QHashPrivate::MultiNode<int,_int>_> *)operator_new(0x28);
    QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::Data(pDVar2,in_stack_ffffffffffffffd8);
    *in_RDI = (long)pDVar2;
  }
  else {
    pDVar2 = (Data<QHashPrivate::MultiNode<int,_int>_> *)operator_new(0x28);
    QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::Data(pDVar2,in_stack_ffffffffffffffd0);
    bVar1 = QtPrivate::RefCount::deref(&pDVar2->ref);
    if ((!bVar1) && (pvVar3 = (void *)*in_RDI, pvVar3 != (void *)0x0)) {
      QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::~Data(pDVar2);
      operator_delete(pvVar3,0x28);
    }
    *in_RDI = (long)pDVar2;
  }
  return;
}

Assistant:

void detach_helper()
    {
        if (!d) {
            d = new Data;
            return;
        }
        Data *dd = new Data(*d);
        if (!d->ref.deref())
            delete d;
        d = dd;
    }